

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  Path *this_00;
  char *pcVar5;
  undefined7 in_register_00000011;
  size_t extraout_RDX_00;
  char *__n;
  size_t extraout_RDX_01;
  size_t sVar6;
  char *pcVar7;
  size_t extraout_RDX_02;
  char (*params) [3];
  String *p;
  String *pSVar8;
  long lVar9;
  size_t sVar10;
  Path *pPVar11;
  byte bVar12;
  char *pcVar13;
  String *pSVar14;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  StringPtr part_01;
  Fault f;
  size_t extraout_RDX;
  
  part.size_ = (char (*) [2])CONCAT71(in_register_00000011,absolute);
  sVar6 = (this->parts).size_;
  if (sVar6 == 0) {
    if (!absolute) {
      str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x37c44a,part.size_);
      return __return_storage_ptr__;
    }
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0xc4,FAILED,"!absolute","\"absolute path is missing disk designator\"",
               (char (*) [41])"absolute path is missing disk designator");
    _::Debug::Fault::~Fault(&f);
    str<char_const(&)[3]>(__return_storage_ptr__,(kj *)"\\\\",params);
    return __return_storage_ptr__;
  }
  pSVar8 = (this->parts).ptr;
  if (absolute) {
    pPVar11 = (Path *)(pSVar8->content).size_;
    this_00 = pPVar11;
    if (pPVar11 != (Path *)0x0) {
      this_00 = (Path *)(pSVar8->content).ptr;
    }
    pcVar13 = (char *)0x0;
    if (pPVar11 != (Path *)0x0) {
      pcVar13 = (char *)((long)&pPVar11[-1].parts.disposer + 7);
    }
    part.ptr = pcVar13;
    bVar1 = Path::isWin32Drive(this_00,part);
    if ((!bVar1) &&
       (part_00.size_ = extraout_RDX, part_00.ptr = pcVar13,
       bVar2 = Path::isNetbiosName(this_00,part_00), !bVar2)) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0xd2,FAILED,(char *)0x0,
                 "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                 ,(char (*) [70])
                  "absolute win32 path must start with drive letter or netbios host name",pSVar8);
      _::Debug::Fault::fatal(&f);
    }
    bVar2 = !bVar1;
    if (forApi) {
      uVar3 = (ulong)!bVar1 * 4 + 4;
      bVar12 = 1;
    }
    else {
      uVar3 = (ulong)((uint)!bVar1 * 2);
      bVar12 = 0;
    }
  }
  else {
    uVar3 = 0;
    bVar12 = 0;
    bVar2 = false;
  }
  sVar10 = (uVar3 + sVar6) - 1;
  for (lVar4 = sVar6 * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    sVar6 = (pSVar8->content).size_;
    lVar9 = sVar6 - 1;
    if (sVar6 == 0) {
      lVar9 = 0;
    }
    sVar10 = sVar10 + lVar9;
    pSVar8 = pSVar8 + 1;
  }
  heapString(__return_storage_ptr__,sVar10);
  pcVar13 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar13 != (char *)0x0) {
    pcVar13 = (__return_storage_ptr__->content).ptr;
  }
  if (bVar12 == 0) {
    if (!bVar2) goto LAB_0030fc04;
    pcVar7 = pcVar13 + 1;
    *pcVar13 = '\\';
    lVar4 = 2;
  }
  else {
    builtin_strncpy(pcVar13,"\\\\?\\",4);
    if (!bVar2) {
      pcVar13 = pcVar13 + 4;
      goto LAB_0030fc04;
    }
    pcVar13[4] = 'U';
    pcVar13[5] = 'N';
    pcVar7 = pcVar13 + 7;
    pcVar13[6] = 'C';
    lVar4 = 8;
  }
  pcVar13 = pcVar13 + lVar4;
  *pcVar7 = '\\';
LAB_0030fc04:
  pSVar8 = (this->parts).ptr;
  pSVar14 = pSVar8 + (this->parts).size_;
  bVar2 = false;
  sVar6 = extraout_RDX_00;
  for (; pSVar8 != pSVar14; pSVar8 = pSVar8 + 1) {
    if (bVar2) {
      *pcVar13 = '\\';
      pcVar13 = pcVar13 + 1;
    }
    sVar10 = (pSVar8->content).size_;
    pPVar11 = (Path *)0x33812f;
    if (sVar10 != 0) {
      pPVar11 = (Path *)(pSVar8->content).ptr;
    }
    part_01.content.ptr = (char *)(sVar10 + (sVar10 == 0));
    part_01.content.size_ = sVar6;
    bVar2 = Path::isWin32Special(pPVar11,part_01);
    if (bVar2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38],kj::String_const&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0xf9,FAILED,"!Path::isWin32Special(p)",
                 "\"path cannot contain DOS reserved name\", p",
                 (char (*) [38])"path cannot contain DOS reserved name",pSVar8);
      pcVar7 = (char *)0x0;
      while( true ) {
        sVar6 = (pSVar8->content).size_;
        pcVar5 = (char *)0x0;
        if (sVar6 != 0) {
          pcVar5 = (char *)(sVar6 - 1);
        }
        if (pcVar5 <= pcVar7) break;
        pcVar13[(long)pcVar7] = '|';
        pcVar7 = pcVar7 + 1;
      }
      _::Debug::Fault::~Fault(&f);
      sVar6 = extraout_RDX_02;
    }
    else {
      pcVar7 = (char *)(pSVar8->content).size_;
      pcVar5 = pcVar7;
      if (pcVar7 != (char *)0x0) {
        pcVar5 = (pSVar8->content).ptr;
      }
      __n = pcVar7 + -1;
      if (pcVar7 == (char *)0x0) {
        __n = (char *)0x0;
      }
      memcpy(pcVar13,pcVar5,(size_t)__n);
      sVar10 = (pSVar8->content).size_;
      sVar6 = extraout_RDX_01;
      pcVar7 = (char *)(sVar10 - 1);
      if (sVar10 == 0) {
        pcVar7 = (char *)0x0;
      }
    }
    pcVar13 = pcVar7 + (long)pcVar13;
    bVar2 = true;
  }
  sVar6 = (__return_storage_ptr__->content).size_;
  pcVar7 = (__return_storage_ptr__->content).ptr + (sVar6 - 1);
  if (sVar6 == 0) {
    pcVar7 = (char *)0x0;
  }
  if (pcVar13 == pcVar7) {
    lVar9 = 0;
    lVar4 = sVar6 - 1;
    if (sVar6 == 0) {
      lVar4 = lVar9;
    }
    for (; lVar4 != lVar9; lVar9 = lVar9 + 1) {
      if (((__return_storage_ptr__->content).ptr[lVar9] == ':') &&
         ((ulong)bVar12 * 4 + 1 != lVar9 || !absolute)) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x113,FAILED,(char *)0x0,
                   "\"colons are prohibited in win32 paths to avoid triggering alterante data streams\", result"
                   ,(char (*) [80])
                    "colons are prohibited in win32 paths to avoid triggering alterante data streams"
                   ,__return_storage_ptr__);
        (__return_storage_ptr__->content).ptr[lVar9] = '|';
        _::Debug::Fault::~Fault(&f);
      }
    }
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x106,FAILED,"ptr == result.end()","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alterante data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}